

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.cc
# Opt level: O1

void CRYPTO_hchacha20(uint8_t *out,uint8_t *key,uint8_t *nonce)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint local_4c;
  ulong local_40;
  
  uVar1 = *(uint *)key;
  uVar2 = *(uint *)(key + 4);
  uVar4 = *(uint *)(key + 8);
  uVar10 = *(uint *)(key + 0xc);
  local_4c = *(uint *)(key + 0x10);
  uVar6 = *(uint *)(key + 0x14);
  uVar16 = *(uint *)(key + 0x18);
  uVar17 = *(uint *)(key + 0x1c);
  uVar7 = *(uint *)nonce;
  uVar11 = *(uint *)(nonce + 4);
  uVar12 = *(uint *)(nonce + 8);
  uVar3 = *(uint *)(nonce + 0xc);
  uVar14 = 0x6b206574;
  uVar15 = 0x79622d32;
  uVar5 = 0x3320646e;
  uVar9 = 0x61707865;
  local_40 = 0xfffffffffffffffe;
  do {
    uVar7 = uVar7 ^ uVar9 + uVar1;
    uVar8 = uVar7 << 0x10 | uVar7 >> 0x10;
    local_4c = local_4c + uVar8;
    uVar7 = uVar1 ^ local_4c;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar9 = uVar9 + uVar1 + uVar7;
    uVar8 = uVar8 ^ uVar9;
    uVar8 = uVar8 << 8 | uVar8 >> 0x18;
    local_4c = local_4c + uVar8;
    uVar7 = uVar7 ^ local_4c;
    uVar1 = uVar7 << 7 | uVar7 >> 0x19;
    uVar11 = uVar11 ^ uVar5 + uVar2;
    uVar11 = uVar11 << 0x10 | uVar11 >> 0x10;
    uVar6 = uVar6 + uVar11;
    uVar7 = uVar2 ^ uVar6;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar5 = uVar5 + uVar2 + uVar7;
    uVar11 = uVar11 ^ uVar5;
    uVar11 = uVar11 << 8 | uVar11 >> 0x18;
    uVar6 = uVar6 + uVar11;
    uVar7 = uVar7 ^ uVar6;
    uVar2 = uVar7 << 7 | uVar7 >> 0x19;
    uVar12 = uVar12 ^ uVar15 + uVar4;
    uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
    uVar16 = uVar16 + uVar12;
    uVar7 = uVar4 ^ uVar16;
    uVar7 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar15 = uVar15 + uVar4 + uVar7;
    uVar12 = uVar12 ^ uVar15;
    uVar12 = uVar12 << 8 | uVar12 >> 0x18;
    uVar16 = uVar16 + uVar12;
    uVar7 = uVar7 ^ uVar16;
    uVar7 = uVar7 << 7 | uVar7 >> 0x19;
    uVar3 = uVar3 ^ uVar14 + uVar10;
    uVar4 = uVar3 << 0x10 | uVar3 >> 0x10;
    uVar17 = uVar17 + uVar4;
    uVar3 = uVar10 ^ uVar17;
    uVar3 = uVar3 << 0xc | uVar3 >> 0x14;
    uVar14 = uVar14 + uVar10 + uVar3;
    uVar4 = uVar4 ^ uVar14;
    uVar4 = uVar4 << 8 | uVar4 >> 0x18;
    uVar17 = uVar17 + uVar4;
    uVar3 = uVar3 ^ uVar17;
    uVar13 = uVar3 << 7 | uVar3 >> 0x19;
    uVar9 = uVar9 + uVar2;
    uVar4 = uVar4 ^ uVar9;
    uVar4 = uVar4 << 0x10 | uVar4 >> 0x10;
    uVar16 = uVar16 + uVar4;
    uVar2 = uVar2 ^ uVar16;
    uVar2 = uVar2 << 0xc | uVar2 >> 0x14;
    uVar9 = uVar9 + uVar2;
    uVar4 = uVar4 ^ uVar9;
    uVar3 = uVar4 << 8 | uVar4 >> 0x18;
    uVar16 = uVar16 + uVar3;
    uVar2 = uVar2 ^ uVar16;
    uVar2 = uVar2 << 7 | uVar2 >> 0x19;
    uVar5 = uVar5 + uVar7;
    uVar8 = uVar8 ^ uVar5;
    uVar4 = uVar8 << 0x10 | uVar8 >> 0x10;
    uVar17 = uVar17 + uVar4;
    uVar7 = uVar7 ^ uVar17;
    uVar10 = uVar7 << 0xc | uVar7 >> 0x14;
    uVar5 = uVar5 + uVar10;
    uVar4 = uVar4 ^ uVar5;
    uVar7 = uVar4 << 8 | uVar4 >> 0x18;
    uVar17 = uVar17 + uVar7;
    uVar10 = uVar10 ^ uVar17;
    uVar4 = uVar10 << 7 | uVar10 >> 0x19;
    uVar15 = uVar15 + uVar13;
    uVar11 = uVar11 ^ uVar15;
    uVar10 = uVar11 << 0x10 | uVar11 >> 0x10;
    local_4c = local_4c + uVar10;
    uVar13 = uVar13 ^ local_4c;
    uVar8 = uVar13 << 0xc | uVar13 >> 0x14;
    uVar15 = uVar15 + uVar8;
    uVar10 = uVar10 ^ uVar15;
    uVar11 = uVar10 << 8 | uVar10 >> 0x18;
    local_4c = local_4c + uVar11;
    uVar8 = uVar8 ^ local_4c;
    uVar10 = uVar8 << 7 | uVar8 >> 0x19;
    uVar14 = uVar14 + uVar1;
    uVar12 = uVar12 ^ uVar14;
    uVar12 = uVar12 << 0x10 | uVar12 >> 0x10;
    uVar6 = uVar6 + uVar12;
    uVar1 = uVar1 ^ uVar6;
    uVar1 = uVar1 << 0xc | uVar1 >> 0x14;
    uVar14 = uVar14 + uVar1;
    uVar12 = uVar12 ^ uVar14;
    uVar12 = uVar12 << 8 | uVar12 >> 0x18;
    uVar6 = uVar6 + uVar12;
    uVar1 = uVar1 ^ uVar6;
    uVar1 = uVar1 << 7 | uVar1 >> 0x19;
    local_40 = local_40 + 2;
  } while (local_40 < 0x12);
  *(uint *)out = uVar9;
  *(uint *)(out + 4) = uVar5;
  *(uint *)(out + 8) = uVar15;
  *(uint *)(out + 0xc) = uVar14;
  *(uint *)(out + 0x10) = uVar7;
  *(uint *)(out + 0x14) = uVar11;
  *(uint *)(out + 0x18) = uVar12;
  *(uint *)(out + 0x1c) = uVar3;
  return;
}

Assistant:

void CRYPTO_hchacha20(uint8_t out[32], const uint8_t key[32],
                      const uint8_t nonce[16]) {
  uint32_t x[16];
  OPENSSL_memcpy(x, sigma, sizeof(sigma));
  OPENSSL_memcpy(&x[4], key, 32);
  OPENSSL_memcpy(&x[12], nonce, 16);

  for (size_t i = 0; i < 20; i += 2) {
    QUARTERROUND(0, 4, 8, 12)
    QUARTERROUND(1, 5, 9, 13)
    QUARTERROUND(2, 6, 10, 14)
    QUARTERROUND(3, 7, 11, 15)
    QUARTERROUND(0, 5, 10, 15)
    QUARTERROUND(1, 6, 11, 12)
    QUARTERROUND(2, 7, 8, 13)
    QUARTERROUND(3, 4, 9, 14)
  }

  OPENSSL_memcpy(out, &x[0], sizeof(uint32_t) * 4);
  OPENSSL_memcpy(&out[16], &x[12], sizeof(uint32_t) * 4);
}